

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O3

void latency_tcp_main(void)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  host_tuple *phVar8;
  request *prVar9;
  ssize_t sVar10;
  application_protocol *paVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  tcp_connection *conn;
  long lVar17;
  long in_FS_OFFSET;
  byte_req_pair bVar18;
  sockaddr_in addr;
  int one;
  int million;
  linger linger;
  sockaddr local_68;
  double local_58;
  char *local_50;
  undefined4 local_48;
  undefined4 local_44;
  uint16_t *local_40;
  undefined8 local_38;
  
  local_44 = 1000000;
  local_48 = 1;
  local_68.sa_family = 2;
  iVar2 = get_conn_count();
  iVar3 = get_thread_count();
  iVar4 = (int)((long)iVar2 / (long)iVar3);
  pvVar7 = calloc((long)iVar4,0x400c);
  *(void **)(in_FS_OFFSET + -0x1f0) = pvVar7;
  phVar8 = get_targets();
  if (0 < iVar4) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      iVar4 = socket(2,1,0);
      if (iVar4 == -1) {
        latency_tcp_main_cold_8();
LAB_00109a8c:
        exit(-1);
      }
      iVar5 = get_target_count();
      uVar13 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) %
               (long)iVar5 & 0xffffffff;
      local_68.sa_data._0_2_ = phVar8[uVar13].port << 8 | phVar8[uVar13].port >> 8;
      local_68.sa_data._2_4_ = phVar8[uVar13].ip;
      iVar5 = connect(iVar4,&local_68,0x10);
      if (iVar5 != 0) {
        latency_tcp_main_cold_1();
        goto LAB_00109a8c;
      }
      iVar5 = setsockopt(iVar4,6,1,&local_48,4);
      if (iVar5 != 0) {
        latency_tcp_main_cold_2();
        goto LAB_00109a8c;
      }
      local_38 = 1;
      iVar5 = setsockopt(iVar4,1,0xd,&local_38,8);
      if (iVar5 != 0) {
        latency_tcp_main_cold_3();
LAB_00109aff:
        __assert_fail("conn->buffer_idx == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                      ,0x17e,"void latency_tcp_main(void)");
      }
      iVar5 = setsockopt(iVar4,1,0x2e,&local_44,4);
      if (iVar5 != 0) {
        latency_tcp_main_cold_4();
        goto LAB_00109a8c;
      }
      lVar12 = *(long *)(in_FS_OFFSET + -0x1f0);
      *(int *)(lVar12 + lVar16) = iVar4;
      *(undefined2 *)(lVar12 + 6 + lVar16) = 0;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x400c;
    } while (((long)iVar2 / (long)iVar3 & 0xffffffffU) != uVar15);
  }
  iVar2 = clock_gettime(1,(timespec *)&local_68);
  if (iVar2 == 0) {
    lVar16 = CONCAT44(local_68.sa_data._2_4_,CONCAT22(local_68.sa_data._0_2_,local_68.sa_family));
    while( true ) {
      lVar16 = (long)((double)lVar16 * 1000000000.0 + (double)(long)local_68.sa_data._6_8_);
      while (iVar2 = should_load(), iVar2 != 0) {
        iVar2 = clock_gettime(1,(timespec *)&local_68);
        if (iVar2 != 0) goto LAB_00109a9d;
        if (lVar16 <= (long)((double)CONCAT44(local_68.sa_data._2_4_,
                                              CONCAT22(local_68.sa_data._0_2_,local_68.sa_family)) *
                             1000000000.0 + (double)(long)local_68.sa_data._6_8_)) {
          uVar14 = *(uint *)(in_FS_OFFSET + -0x1e0);
          *(uint *)(in_FS_OFFSET + -0x1e0) = uVar14 + 1;
          iVar2 = get_conn_count();
          iVar3 = get_thread_count();
          lVar12 = *(long *)(in_FS_OFFSET + -0x1f0);
          lVar17 = (long)(int)((ulong)uVar14 % ((long)iVar2 / (long)iVar3 & 0xffffffffU)) * 0x400c;
          uVar1 = *(ushort *)(lVar12 + 8 + lVar17);
          iVar2 = get_max_pending_reqs();
          if (((int)(uint)uVar1 < iVar2) &&
             (conn = (tcp_connection *)(lVar12 + lVar17), conn->closed == 0)) {
            prVar9 = prepare_request();
            if ((long)prVar9->iov_cnt < 1) {
              uVar14 = 0;
            }
            else {
              lVar12 = 0;
              uVar14 = 0;
              do {
                uVar14 = uVar14 + *(int *)((long)&prVar9->iovs[0].iov_len + lVar12);
                lVar12 = lVar12 + 0x10;
              } while ((long)prVar9->iov_cnt * 0x10 != lVar12);
            }
            iVar2 = clock_gettime(1,(timespec *)&local_68);
            if (iVar2 != 0) goto LAB_00109a9d;
            local_50 = (char *)(double)(long)local_68.sa_data._6_8_;
            local_58 = (double)CONCAT44(local_68.sa_data._2_4_,
                                        CONCAT22(local_68.sa_data._0_2_,local_68.sa_family)) *
                       1000000000.0;
            sVar10 = writev(conn->fd,(iovec *)prVar9->iovs,prVar9->iov_cnt);
            uVar6 = (uint)sVar10;
            if ((int)uVar6 < 0) {
              latency_tcp_main_cold_7();
              return;
            }
            if (uVar14 != uVar6) {
              __assert_fail("ret == bytes_to_send",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                            ,0x178,"void latency_tcp_main(void)");
            }
            bVar18.reqs = 1;
            bVar18.bytes = (ulong)(uVar6 & 0x7fffffff);
            add_throughput_tx_sample(bVar18);
            if (conn->buffer_idx != 0) goto LAB_00109aff;
            local_40 = &conn->closed;
            local_58 = (double)(long)(local_58 + (double)local_50);
            local_50 = conn->buffer;
            uVar1 = 0;
            do {
              if (0x3fff < uVar1) {
                __assert_fail("MAX_PAYLOAD - conn->buffer_idx > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                              ,0x180,"void latency_tcp_main(void)");
              }
              sVar10 = recv(conn->fd,local_50 + uVar1,(ulong)(ushort)(0x4000 - uVar1),0);
              if ((int)sVar10 < 0) {
                latency_tcp_main_cold_6();
                return;
              }
              if ((int)sVar10 == 0) {
                latency_tcp_main_cold_5();
              }
              else {
                conn->buffer_idx = conn->buffer_idx + (short)sVar10;
                bVar18 = handle_response(conn);
                if (bVar18.reqs != 0) {
                  paVar11 = get_app_proto();
                  if ((bVar18.reqs != 1) && (paVar11->type == PROTO_MEMCACHED_BIN)) {
                    __assert_fail("read_res.reqs == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                                  ,0x191,"void latency_tcp_main(void)");
                  }
                  iVar2 = clock_gettime(1,(timespec *)&local_68);
                  if (iVar2 != 0) goto LAB_00109a9d;
                  lVar12 = (long)((double)CONCAT44(local_68.sa_data._2_4_,
                                                   CONCAT22(local_68.sa_data._0_2_,
                                                            local_68.sa_family)) * 1000000000.0 +
                                 (double)(long)local_68.sa_data._6_8_) - (long)local_58;
                  add_throughput_rx_sample(bVar18);
                  add_latency_sample(lVar12,(timespec *)0x0);
                  lVar12 = get_ia();
                  lVar16 = lVar16 + lVar12;
                }
              }
              uVar1 = conn->buffer_idx;
            } while (uVar1 != 0);
          }
        }
      }
      iVar2 = clock_gettime(1,(timespec *)&local_68);
      if (iVar2 != 0) break;
      lVar16 = CONCAT44(local_68.sa_data._2_4_,CONCAT22(local_68.sa_data._0_2_,local_68.sa_family));
    }
  }
LAB_00109a9d:
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                ,0x28,"int64_t time_ns()");
}

Assistant:

static void latency_tcp_main(void)
{
	int i, ret, bytes_to_send;
	long start_time, end_time, next_tx;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;

	if (latency_open_connections())
		exit(-1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		if (time_ns() < next_tx)
			continue;
		conn = pick_conn();
		if (!conn)
			continue;

		to_send = prepare_request();
		bytes_to_send = 0;
		for (i = 0; i < to_send->iov_cnt; i++)
			bytes_to_send += to_send->iovs[i].iov_len;

		start_time = time_ns();
		ret = writev(conn->fd, to_send->iovs, to_send->iov_cnt);
		if (ret < 0) {
			lancet_perror("Writev failed\n");
			return;
		}
		assert(ret == bytes_to_send);
		/* Bookkeeping */
		send_res.bytes = ret;
		send_res.reqs = 1;
		add_throughput_tx_sample(send_res);

		assert(conn->buffer_idx == 0);
		do {
			assert(MAX_PAYLOAD - conn->buffer_idx > 0);
			ret = recv(conn->fd, &conn->buffer[conn->buffer_idx], MAX_PAYLOAD - conn->buffer_idx, 0);
			if (ret < 0) {
				lancet_perror("Error read\n");
				return;
			}
			if (ret == 0) {
				close(conn->fd);
				lancet_fprintf(stderr, "Connection closed\n");
				conn->closed = 1;
				continue;
			}

			conn->buffer_idx += ret;
			read_res = handle_response(conn);
			if (read_res.reqs > 0) {
                                if (get_app_proto()->type == PROTO_MEMCACHED_BIN) {
                                        assert(read_res.reqs == 1);
                                }
				end_time = time_ns();
				/*BookKeeping*/
				add_throughput_rx_sample(read_res);
				add_latency_sample((end_time - start_time), NULL);

				/*Schedule next*/
				next_tx += get_ia();
			}
		} while (conn->buffer_idx);
	}
}